

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

bool tinyexr::ReadAttribute
               (string *name,string *type,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *data,size_t *marker_size,
               char *marker,size_t size)

{
  pointer __dest;
  int *piVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  size_t *psVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  uint *puVar6;
  undefined8 uVar7;
  char *pcVar8;
  ulong __new_size;
  int *piVar9;
  int *piVar10;
  ulong *puVar11;
  size_t __maxlen;
  ulong uVar12;
  bool bVar13;
  value_type vStack_f8;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *pvStack_c0;
  undefined1 *apuStack_b8 [2];
  undefined1 auStack_a8 [16];
  ulong uStack_98;
  uint *puStack_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_88;
  size_t *psStack_80;
  size_t sStack_78;
  code *pcStack_70;
  string *local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_60;
  size_t *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcStack_70 = (code *)0x1cd3af;
  local_68 = type;
  sVar4 = strnlen(marker,size);
  if (sVar4 != size) {
    pcStack_70 = (code *)0x1cd3e2;
    local_60 = data;
    local_58 = marker_size;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,marker,marker + sVar4);
    pcStack_70 = (code *)0x1cd3ed;
    std::__cxx11::string::operator=((string *)name,(string *)local_50);
    if (local_50[0] != local_40) {
      pcStack_70 = (code *)0x1cd3fa;
      operator_delete(local_50[0]);
    }
    pcVar8 = marker + sVar4 + 1;
    __maxlen = size - (sVar4 + 1);
    pcStack_70 = (code *)0x1cd412;
    sVar5 = strnlen(pcVar8,__maxlen);
    if (sVar5 != __maxlen) {
      pcStack_70 = (code *)0x1cd435;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar8,pcVar8 + sVar5);
      pcStack_70 = (code *)0x1cd441;
      std::__cxx11::string::operator=((string *)local_68,(string *)local_50);
      if (local_50[0] != local_40) {
        pcStack_70 = (code *)0x1cd44e;
        operator_delete(local_50[0]);
      }
      psVar2 = local_58;
      this = local_60;
      uVar12 = __maxlen - (sVar5 + 1);
      if (3 < uVar12) {
        puVar6 = (uint *)(pcVar8 + sVar5 + 1);
        __new_size = (ulong)*puVar6;
        if (__new_size == 0) {
          pcStack_70 = (code *)0x1cd4c3;
          iVar3 = std::__cxx11::string::compare((char *)local_68);
          if (iVar3 == 0) {
            *psVar2 = sVar4 + sVar5 + 6;
            pcStack_70 = (code *)0x1cd4f0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,1);
            *(this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start = '\0';
            return true;
          }
        }
        else if (__new_size <= uVar12 - 4) {
          pcStack_70 = (code *)0x1cd48a;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_60,__new_size);
          __dest = (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          if ((this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish != __dest) {
            pcStack_70 = (code *)0x1cd4a3;
            memcpy(__dest,pcVar8 + sVar5 + 5,__new_size);
            *psVar2 = __new_size + sVar4 + sVar5 + 6;
            return true;
          }
          pcVar8 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
          puVar11 = (ulong *)0x0;
          pcStack_70 = ReadChannelInfo;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
          psStack_80 = psVar2;
          pvStack_88 = this;
          piVar10 = (int *)*puVar11;
          pvStack_c0 = (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)
                       pcVar8;
          uStack_98 = __new_size;
          puStack_90 = puVar6;
          sStack_78 = sVar4;
          pcStack_70 = (code *)sVar5;
          if ((int *)puVar11[1] == piVar10) {
            uVar7 = std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,0,0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vStack_f8.name._M_dataplus._M_p != &vStack_f8.name.field_2) {
              operator_delete(vStack_f8.name._M_dataplus._M_p);
            }
            _Unwind_Resume(uVar7);
          }
          do {
            vStack_f8.name._M_dataplus._M_p = (pointer)&vStack_f8.name.field_2;
            iVar3 = *piVar10;
            if ((char)iVar3 == '\0') break;
            vStack_f8.name._M_string_length = 0;
            vStack_f8.name.field_2._M_local_buf[0] = '\0';
            piVar1 = (int *)puVar11[1];
            if ((long)piVar1 - (long)piVar10 < 0) {
              bVar13 = false;
            }
            else {
              bVar13 = piVar1 != piVar10;
              if (piVar1 == piVar10) {
LAB_001cd5dc:
                vStack_f8.name._M_string_length = 0;
                vStack_f8.name.field_2._M_local_buf[0] = '\0';
                piVar10 = (int *)0x0;
              }
              else {
                piVar9 = piVar10;
                if ((char)*piVar10 != '\0') {
                  uVar12 = 1;
                  do {
                    bVar13 = uVar12 < (ulong)((long)piVar1 - (long)piVar10);
                    if (!bVar13) goto LAB_001cd5dc;
                    piVar9 = (int *)((long)piVar9 + 1);
                    uVar12 = uVar12 + 1;
                  } while (*(char *)piVar9 != '\0');
                }
                if (!bVar13) goto LAB_001cd5dc;
                apuStack_b8[0] = auStack_a8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)apuStack_b8,piVar10,piVar9);
                std::__cxx11::string::operator=((string *)&vStack_f8,(string *)apuStack_b8);
                if (apuStack_b8[0] != auStack_a8) {
                  operator_delete(apuStack_b8[0]);
                }
                piVar10 = (int *)((long)piVar9 + 1);
              }
              if ((piVar10 == (int *)0x0) && (vStack_f8.name._M_string_length == 0)) {
                piVar10 = (int *)0x0;
                bVar13 = false;
              }
              else {
                bVar13 = piVar10 + 4 < (int *)puVar11[1];
                if (bVar13) {
                  vStack_f8.pixel_type = *piVar10;
                  vStack_f8.p_linear = (uchar)piVar10[1];
                  vStack_f8.x_sampling = piVar10[2];
                  vStack_f8.y_sampling = piVar10[3];
                  bVar13 = true;
                  std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
                  push_back(pvStack_c0,&vStack_f8);
                  piVar10 = piVar10 + 4;
                }
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vStack_f8.name._M_dataplus._M_p != &vStack_f8.name.field_2) {
              operator_delete(vStack_f8.name._M_dataplus._M_p);
            }
          } while (bVar13);
          return (char)iVar3 == '\0';
        }
      }
    }
  }
  return false;
}

Assistant:

static bool ReadAttribute(std::string *name, std::string *type,
                          std::vector<unsigned char> *data, size_t *marker_size,
                          const char *marker, size_t size) {
  size_t name_len = strnlen(marker, size);
  if (name_len == size) {
    // String does not have a terminating character.
    return false;
  }
  *name = std::string(marker, name_len);

  marker += name_len + 1;
  size -= name_len + 1;

  size_t type_len = strnlen(marker, size);
  if (type_len == size) {
    return false;
  }
  *type = std::string(marker, type_len);

  marker += type_len + 1;
  size -= type_len + 1;

  if (size < sizeof(uint32_t)) {
    return false;
  }

  uint32_t data_len;
  memcpy(&data_len, marker, sizeof(uint32_t));
  tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

  if (data_len == 0) {
    if ((*type).compare("string") == 0) {
      // Accept empty string attribute.

      marker += sizeof(uint32_t);
      size -= sizeof(uint32_t);

      *marker_size = name_len + 1 + type_len + 1 + sizeof(uint32_t);

      data->resize(1);
      (*data)[0] = '\0';

      return true;
    } else {
      return false;
    }
  }

  marker += sizeof(uint32_t);
  size -= sizeof(uint32_t);

  if (size < data_len) {
    return false;
  }

  data->resize(static_cast<size_t>(data_len));
  memcpy(&data->at(0), marker, static_cast<size_t>(data_len));

  *marker_size = name_len + 1 + type_len + 1 + sizeof(uint32_t) + data_len;
  return true;
}